

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

HelicsComplex helicsDataBufferToComplexObject(HelicsDataBuffer data)

{
  DataType baseType;
  Message *pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  HelicsComplex HVar4;
  undefined1 local_38 [8];
  double dStack_30;
  data_view local_28;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar1 == (Message *)0x0) {
      uVar2 = 0xfaf472ca;
      uVar3 = 0xc814fb89;
      dStack_30 = -1.785e+39;
      goto LAB_001b177f;
    }
    data = &pMVar1->data;
  }
  local_38 = (undefined1  [8])0x0;
  dStack_30 = 0.0;
  local_28.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
  local_28.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  baseType = helics::detail::detectType((byte *)local_28.dblock._M_str);
  helics::valueExtract(&local_28,baseType,(complex<double> *)local_38);
  if (local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  uVar2 = local_38._0_4_;
  uVar3 = local_38._4_4_;
LAB_001b177f:
  HVar4.real._4_4_ = uVar3;
  HVar4.real._0_4_ = uVar2;
  HVar4.imag = dStack_30;
  return HVar4;
}

Assistant:

helics::SmallBuffer* getBuffer(HelicsDataBuffer data)
{
    auto* ptr = reinterpret_cast<helics::SmallBuffer*>(data);
    if (ptr != nullptr && ptr->userKey == gBufferValidationIdentifier) {
        return ptr;
    }
    auto* message = getMessageObj(data, nullptr);
    if (message != nullptr) {
        return &message->data;
    }
    return nullptr;
}